

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

void jsonEscape(FILE *stream,char *in)

{
  char cVar1;
  size_t sVar2;
  char *in_end;
  char *i;
  char *in_local;
  FILE *stream_local;
  
  sVar2 = strlen(in);
  for (in_end = in; in_end < in + sVar2; in_end = in_end + 1) {
    cVar1 = *in_end;
    if (cVar1 == '\b') {
      fputs("\\b",(FILE *)stream);
    }
    else if (cVar1 == '\t') {
      fputs("\\t",(FILE *)stream);
    }
    else if (cVar1 == '\n') {
      fputs("\\n",(FILE *)stream);
    }
    else if (cVar1 == '\f') {
      fputs("\\f",(FILE *)stream);
    }
    else if (cVar1 == '\r') {
      fputs("\\r",(FILE *)stream);
    }
    else if (cVar1 == '\"') {
      fputs("\\\"",(FILE *)stream);
    }
    else if (cVar1 == '\\') {
      fputs("\\\\",(FILE *)stream);
    }
    else if (*in_end < ' ') {
      curl_mfprintf(stream,"u%04x",(int)*in_end);
    }
    else {
      fputc((int)*in_end,(FILE *)stream);
    }
  }
  return;
}

Assistant:

static void jsonEscape(FILE *stream, const char *in)
{
  const char *i = in;
  const char *in_end = in + strlen(in);

  for(; i < in_end; i++) {
    switch(*i) {
    case '\\':
      fputs("\\\\", stream);
      break;
    case '\"':
      fputs("\\\"", stream);
      break;
    case '\b':
      fputs("\\b", stream);
      break;
    case '\f':
      fputs("\\f", stream);
      break;
    case '\n':
      fputs("\\n", stream);
      break;
    case '\r':
      fputs("\\r", stream);
      break;
    case '\t':
      fputs("\\t", stream);
      break;
    default:
      if (*i < 32) {
        fprintf(stream, "u%04x", *i);
      }
      else {
        fputc(*i, stream);
      }
      break;
    };
  }
}